

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O0

int Bmc_CollapseExpand(sat_solver *pSat,sat_solver *pSatOn,Vec_Int_t *vLits,Vec_Int_t *vNums,
                      Vec_Int_t *vTemp,int nBTLimit,int fCanon,int fOnOffSetLit)

{
  sat_solver *s;
  int iVar1;
  int iVar2;
  int *begin;
  int *end;
  int local_5c;
  int iLit_1;
  int i_1;
  int *pFinal;
  int nFinal;
  int status;
  int iLit;
  int k;
  int i;
  int nBTLimit_local;
  Vec_Int_t *vTemp_local;
  Vec_Int_t *vNums_local;
  Vec_Int_t *vLits_local;
  sat_solver *pSatOn_local;
  sat_solver *pSat_local;
  
  k = nBTLimit;
  _i = vTemp;
  vTemp_local = vNums;
  vNums_local = vLits;
  vLits_local = (Vec_Int_t *)pSatOn;
  pSatOn_local = pSat;
  if (fCanon == 0) {
    if (-1 < fOnOffSetLit) {
      Vec_IntPush(vLits,fOnOffSetLit);
    }
    s = pSatOn_local;
    begin = Vec_IntArray(vNums_local);
    end = Vec_IntLimit(vNums_local);
    pFinal._4_4_ = sat_solver_solve(s,begin,end,(long)k,0,0,0);
    if (-1 < fOnOffSetLit) {
      Vec_IntPop(vNums_local);
    }
    if (pFinal._4_4_ == 0) {
      return -1;
    }
    if (pFinal._4_4_ != -1) {
      __assert_fail("status == l_False",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                    ,0x1da,
                    "int Bmc_CollapseExpand(sat_solver *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int, int)"
                   );
    }
    pFinal._0_4_ = sat_solver_final(pSatOn_local,(int **)&iLit_1);
    for (iLit = 0; iVar2 = iLit, iVar1 = Vec_IntSize(vNums_local), iVar2 < iVar1; iLit = iLit + 1) {
      nFinal = Vec_IntEntry(vNums_local,iLit);
      status = 0;
      while ((iVar2 = nFinal, status < (int)pFinal &&
             (iVar1 = Abc_LitNot(_iLit_1[status]), iVar2 != iVar1))) {
        status = status + 1;
      }
      if (status == (int)pFinal) {
        Vec_IntWriteEntry(vNums_local,iLit,-1);
      }
    }
    iVar2 = Bmc_CollapseExpandRound
                      (pSatOn_local,(sat_solver *)0x0,vNums_local,vTemp_local,_i,k,0,fOnOffSetLit);
    if (iVar2 == -1) {
      return -1;
    }
  }
  else {
    iVar2 = Bmc_CollapseExpandRound(pSat,pSatOn,vLits,vNums,vTemp,nBTLimit,fCanon,-1);
    if (iVar2 == -1) {
      return -1;
    }
    iVar2 = Bmc_CollapseExpandRound
                      (pSatOn_local,(sat_solver *)0x0,vNums_local,vTemp_local,_i,k,fCanon,-1);
    if (iVar2 == -1) {
      return -1;
    }
  }
  Vec_IntClear(vTemp_local);
  for (local_5c = 0; iVar2 = Vec_IntSize(vNums_local), local_5c < iVar2; local_5c = local_5c + 1) {
    iVar2 = Vec_IntEntry(vNums_local,local_5c);
    if (iVar2 != -1) {
      Vec_IntPush(vTemp_local,local_5c);
    }
  }
  return 0;
}

Assistant:

int Bmc_CollapseExpand( sat_solver * pSat, sat_solver * pSatOn, Vec_Int_t * vLits, Vec_Int_t * vNums, Vec_Int_t * vTemp, int nBTLimit, int fCanon, int fOnOffSetLit )
{
    // perform one quick reduction if it is non-canonical
    if ( !fCanon )
    {
        int i, k, iLit, status, nFinal, * pFinal;
        // check against offset
        if ( fOnOffSetLit >= 0 )
            Vec_IntPush( vLits, fOnOffSetLit );
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
        if ( fOnOffSetLit >= 0 )
            Vec_IntPop( vLits );
        if ( status == l_Undef )
            return -1;
        assert( status == l_False );
        // get subset of literals
        nFinal = sat_solver_final( pSat, &pFinal );
        // mark unused literals
        Vec_IntForEachEntry( vLits, iLit, i )
        {
            for ( k = 0; k < nFinal; k++ )
                if ( iLit == Abc_LitNot(pFinal[k]) )
                    break;
            if ( k == nFinal )
                Vec_IntWriteEntry( vLits, i, -1 );
        }
        if ( Bmc_CollapseExpandRound( pSat, NULL,   vLits, vNums, vTemp, nBTLimit, fCanon, fOnOffSetLit ) == -1 )
            return -1;
    }
    else
    {
        if ( Bmc_CollapseExpandRound( pSat, pSatOn, vLits, vNums, vTemp, nBTLimit, fCanon, -1 ) == -1 )
            return -1;
        if ( Bmc_CollapseExpandRound( pSat, NULL,   vLits, vNums, vTemp, nBTLimit, fCanon, -1 ) == -1 )
            return -1;
    }
    {
        // put into new array
        int i, iLit;
        Vec_IntClear( vNums );
        Vec_IntForEachEntry( vLits, iLit, i )
            if ( iLit != -1 )
                Vec_IntPush( vNums, i );
    }
    return 0;
}